

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O2

uint64_t helper_fmuld8sux16(uint64_t src1,uint64_t src2)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ((int)src1 >> 0x18) * ((int)src2 >> 0x10);
  uVar2 = (int)(char)(src1 >> 8) * (int)(short)src2;
  return CONCAT44(uVar1 + (uVar1 & 0x80) * 2,uVar2 + (uVar2 & 0x80) * 2);
}

Assistant:

uint64_t helper_fmuld8sux16(uint64_t src1, uint64_t src2)
{
    VIS64 s, d;
    uint32_t tmp;

    s.ll = src1;
    d.ll = src2;

#define PMUL(r)                                                         \
    tmp = (int32_t)d.VIS_SW64(r) * ((int32_t)s.VIS_SW64(r) >> 8);       \
    if ((tmp & 0xff) > 0x7f) {                                          \
        tmp += 0x100;                                                   \
    }                                                                   \
    d.VIS_L64(r) = tmp;

    /* Reverse calculation order to handle overlap */
    PMUL(1);
    PMUL(0);
#undef PMUL

    return d.ll;
}